

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
write_scan_chunk(exr_context_t ctxt,int part_index,exr_priv_part_t part,int y,void *packed_data,
                uint64_t packed_size,uint64_t unpacked_size,void *sample_data,
                uint64_t sample_data_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  long in_R8;
  ulong in_R9;
  uint64_t chunkoff;
  int64_t ddata [3];
  uint64_t *ctable;
  int wrcnt;
  int miny;
  int lpc;
  int cidx;
  int32_t psize;
  int32_t data [3];
  exr_result_t rv;
  undefined8 local_90;
  undefined1 local_88 [32];
  void *local_68;
  int local_5c;
  int in_stack_ffffffffffffffbc;
  int local_3c;
  exr_result_t local_4;
  
  if (*in_RDI == '\x03') {
    if ((*(int *)(in_RDX + 4) == 1) || (*(int *)(in_RDX + 4) == 3)) {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x12);
    }
    else if (*(int *)(in_RDI + 0xb8) == in_ESI) {
      if ((in_R9 == 0) || (in_R8 != 0)) {
        if ((*(int *)(in_RDX + 4) == 2) || (in_R9 < 0x80000000)) {
          iVar1 = (int)in_R9;
          if ((*(int *)(in_RDX + 4) == 2) && ((ddata[0] == 0 || (ddata[1] == 0)))) {
            local_4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,"Invalid sample count data argument size %lu pointer %p",
                                 ddata[1],ddata[0]);
          }
          else if ((in_ECX < *(int *)(in_RDX + 0x94)) || (*(int *)(in_RDX + 0x9c) < in_ECX)) {
            local_4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,
                                 "Invalid attempt to write scanlines starting at %d outside range of data window (%d - %d)"
                                 ,in_ECX,*(undefined4 *)(in_RDX + 0x94),
                                 *(undefined4 *)(in_RDX + 0x9c));
          }
          else {
            iVar2 = (int)*(short *)(in_RDX + 0xf0);
            iVar3 = in_ECX - *(int *)(in_RDX + 0x94);
            if (1 < iVar2) {
              iVar3 = iVar3 / iVar2;
            }
            iVar4 = iVar3 * iVar2 + *(int *)(in_RDX + 0x94);
            if (in_ECX == iVar4) {
              if ((iVar3 < 0) || (*(int *)(in_RDX + 0xf4) <= iVar3)) {
                local_4 = (**(code **)(in_RDI + 0x48))
                                    (in_RDI,3,
                                     "Chunk index for scanline %d in chunk %d outside chunk count %d"
                                     ,in_ECX,iVar3,*(undefined4 *)(in_RDX + 0xf4));
              }
              else if ((*(int *)(in_RDX + 0xb4) == 2) || (*(int *)(in_RDI + 0xbc) == iVar3 + -1)) {
                if (in_RDI[5] == '\0') {
                  in_ESI = iVar4;
                  if (*(int *)(in_RDX + 4) == 2) {
                    local_5c = 1;
                  }
                  else {
                    local_5c = 2;
                    in_stack_ffffffffffffffbc = iVar1;
                  }
                }
                else {
                  in_stack_ffffffffffffffbc = iVar4;
                  if (*(int *)(in_RDX + 4) == 2) {
                    local_5c = 2;
                  }
                  else {
                    local_5c = 3;
                  }
                }
                priv_from_native32(&stack0xffffffffffffffb8,local_5c);
                local_4 = alloc_chunk_table((exr_const_context_t)
                                            CONCAT44(in_stack_ffffffffffffffbc,in_ESI),
                                            (exr_const_priv_part_t)CONCAT44(iVar1,iVar3),
                                            (uint64_t **)CONCAT44(iVar2,iVar4));
                if (local_4 == 0) {
                  *(undefined8 *)((long)local_68 + (long)iVar3 * 8) = *(undefined8 *)(in_RDI + 0xb0)
                  ;
                  local_3c = (**(code **)(in_RDI + 0x30))
                                       (in_RDI,&stack0xffffffffffffffb8,(long)local_5c << 2,
                                        in_RDI + 0xb0);
                  if (((local_3c == 0) && (*(int *)(in_RDX + 4) == 2)) &&
                     (local_3c = (**(code **)(in_RDI + 0x30))(in_RDI,local_88,0x18,in_RDI + 0xb0),
                     local_3c == 0)) {
                    local_3c = (**(code **)(in_RDI + 0x30))(in_RDI,ddata[0],ddata[1],in_RDI + 0xb0);
                  }
                  if ((local_3c == 0) && (in_R9 != 0)) {
                    local_3c = (**(code **)(in_RDI + 0x30))(in_RDI,in_R8,in_R9,in_RDI + 0xb0);
                  }
                  if (local_3c == 0) {
                    *(int *)(in_RDI + 0xc0) = *(int *)(in_RDI + 0xc0) + 1;
                    if (*(int *)(in_RDI + 0xc0) == *(int *)(in_RDX + 0xf4)) {
                      local_90 = *(undefined8 *)(in_RDX + 0xf8);
                      *(int *)(in_RDI + 0xb8) = *(int *)(in_RDI + 0xb8) + 1;
                      if (*(int *)(in_RDI + 0xb8) == *(int *)(in_RDI + 0xc4)) {
                        *in_RDI = '\x05';
                      }
                      in_RDI[0xbc] = -1;
                      in_RDI[0xbd] = -1;
                      in_RDI[0xbe] = -1;
                      in_RDI[0xbf] = -1;
                      in_RDI[0xc0] = '\0';
                      in_RDI[0xc1] = '\0';
                      in_RDI[0xc2] = '\0';
                      in_RDI[0xc3] = '\0';
                      priv_from_native64(local_68,*(int *)(in_RDX + 0xf4));
                      local_3c = (**(code **)(in_RDI + 0x30))
                                           (in_RDI,local_68,(long)*(int *)(in_RDX + 0xf4) << 3,
                                            &local_90);
                      priv_to_native64(local_68,*(int *)(in_RDX + 0xf4));
                    }
                    else {
                      *(int *)(in_RDI + 0xbc) = iVar3;
                    }
                  }
                  local_4 = local_3c;
                }
              }
              else {
                local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x1a);
              }
            }
            else {
              local_4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "Attempt to write scanline %d which does not align with y dims (%d) for chunk index (%d)"
                                   ,in_ECX,iVar4,iVar3);
            }
          }
        }
        else {
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,"Packed data size %lu too large (max %lu)",in_R9,0x7fffffff)
          ;
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"Invalid packed data argument size %lu pointer %p",in_R9,0);
      }
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x19);
    }
  }
  else if (*in_RDI == '\x01') {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,9);
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
  }
  return local_4;
}

Assistant:

static exr_result_t
write_scan_chunk (
    exr_context_t   ctxt,
    int             part_index,
    exr_priv_part_t part,
    int             y,
    const void*     packed_data,
    uint64_t        packed_size,
    uint64_t        unpacked_size,
    const void*     sample_data,
    uint64_t        sample_data_size)
{
    exr_result_t rv;
    int32_t      data[3];
    int32_t      psize;
    int          cidx, lpc, miny, wrcnt;
    uint64_t*    ctable;

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN);
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE);
    }

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI);
    }

    if (ctxt->cur_output_part != part_index)
        return ctxt->standard_error (ctxt, EXR_ERR_INCORRECT_PART);

    if (packed_size > 0 && !packed_data)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid packed data argument size %" PRIu64 " pointer %p",
            (uint64_t) packed_size,
            packed_data);

    if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE &&
        packed_size > (uint64_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Packed data size %" PRIu64 " too large (max %" PRIu64 ")",
            (uint64_t) packed_size,
            (uint64_t) INT32_MAX);
    psize = (int32_t) packed_size;

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE &&
        (!sample_data || sample_data_size == 0))
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid sample count data argument size %" PRIu64 " pointer %p",
            (uint64_t) sample_data_size,
            sample_data);

    if (y < part->data_window.min.y || y > part->data_window.max.y)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid attempt to write scanlines starting at %d outside range of data window (%d - %d)",
            y,
            part->data_window.min.y,
            part->data_window.max.y);
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - part->data_window.min.y);
    if (lpc > 1) cidx /= lpc;

    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);

    miny = cidx * lpc + part->data_window.min.y;

    if (y != miny)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to write scanline %d which does not align with y dims (%d) for chunk index (%d)",
            y,
            miny,
            cidx);
    }

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Chunk index for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count);
    }

    if (part->lineorder != EXR_LINEORDER_RANDOM_Y &&
        ctxt->last_output_chunk != (cidx - 1))
    {
        return ctxt->standard_error (ctxt, EXR_ERR_INCORRECT_CHUNK);
    }

    if (ctxt->is_multipart)
    {
        data[0] = part_index;
        data[1] = miny;
        if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE)
        {
            data[2] = psize;
            wrcnt   = 3;
        }
        else
            wrcnt = 2;
    }
    else
    {
        data[0] = miny;
        if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE)
        {
            data[1] = psize;
            wrcnt   = 2;
        }
        else
            wrcnt = 1;
    }
    priv_from_native32 (data, wrcnt);

    rv = alloc_chunk_table (ctxt, part, &ctable);
    if (rv != EXR_ERR_SUCCESS) return rv;

    ctable[cidx] = ctxt->output_file_offset;
    rv           = ctxt->do_write (
        ctxt,
        data,
        (uint64_t) (wrcnt) * sizeof (int32_t),
        &(ctxt->output_file_offset));
    if (rv == EXR_ERR_SUCCESS &&
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        int64_t ddata[3];
        ddata[0] = (int64_t) sample_data_size;
        ddata[1] = (int64_t) packed_size;
        ddata[2] = (int64_t) unpacked_size;
        rv       = ctxt->do_write (
            ctxt, ddata, 3 * sizeof (uint64_t), &(ctxt->output_file_offset));

        if (rv == EXR_ERR_SUCCESS)
            rv = ctxt->do_write (
                ctxt,
                sample_data,
                sample_data_size,
                &(ctxt->output_file_offset));
    }
    if (rv == EXR_ERR_SUCCESS && packed_size > 0)
        rv = ctxt->do_write (
            ctxt, packed_data, packed_size, &(ctxt->output_file_offset));

    if (rv == EXR_ERR_SUCCESS)
    {
        ++(ctxt->output_chunk_count);
        if (ctxt->output_chunk_count == part->chunk_count)
        {
            uint64_t chunkoff = part->chunk_table_offset;

            ++(ctxt->cur_output_part);
            if (ctxt->cur_output_part == ctxt->num_parts)
                ctxt->mode = EXR_CONTEXT_WRITE_FINISHED;
            ctxt->last_output_chunk  = -1;
            ctxt->output_chunk_count = 0;

            priv_from_native64 (ctable, part->chunk_count);
            rv = ctxt->do_write (
                ctxt,
                ctable,
                sizeof (uint64_t) * (uint64_t) (part->chunk_count),
                &chunkoff);
            /* just in case we look at it again? */
            priv_to_native64 (ctable, part->chunk_count);
        }
        else { ctxt->last_output_chunk = cidx; }
    }

    return rv;
}